

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O1

cl_program xmrig::OclCache::build(IOclRunner *runner)

{
  cl_device_id p_Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cl_int cVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  cl_program program;
  char *pcVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar10;
  undefined4 extraout_var_08;
  cl_program program_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar11;
  undefined4 extraout_var_11;
  undefined1 **ppuVar12;
  long *plVar13;
  undefined1 *puVar14;
  undefined8 uVar15;
  char *in_R8;
  String SVar16;
  string s;
  cl_device_id device;
  char *data_ptr;
  cl_int clStatus;
  size_t bin_size;
  string fileName;
  ostringstream ss;
  ifstream file;
  undefined1 **local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  undefined4 uStack_428;
  undefined4 uStack_424;
  cl_device_id local_420;
  string local_418;
  int local_3f8;
  cl_int local_3f4;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  string local_3d0;
  cl_device_id local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  ios_base local_340 [264];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  int aiStack_218 [122];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (DAT_001b1e48 == 0) {
    program = (cl_program)0x0;
    goto LAB_00163257;
  }
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  iVar3 = (*runner->_vptr_IOclRunner[6])(runner);
  if (*(char *)(CONCAT44(extraout_var,iVar3) + 8) == '\x01') {
    prefix_abi_cxx11_();
    plVar7 = (long *)std::__cxx11::string::append((char *)local_3f0);
    ppuVar12 = (undefined1 **)(plVar7 + 2);
    if ((undefined1 **)*plVar7 == ppuVar12) {
      local_430 = *ppuVar12;
      uStack_428 = (undefined4)plVar7[3];
      uStack_424 = *(undefined4 *)((long)plVar7 + 0x1c);
      local_440 = &local_430;
    }
    else {
      local_430 = *ppuVar12;
      local_440 = (undefined1 **)*plVar7;
    }
    local_438 = (undefined1 *)plVar7[1];
    *plVar7 = (long)ppuVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    iVar3 = (*runner->_vptr_IOclRunner[4])(runner);
    iVar4 = (*runner->_vptr_IOclRunner[3])(runner);
    iVar5 = (*runner->_vptr_IOclRunner[5])(runner);
    cacheKey_abi_cxx11_(&local_418,(OclCache *)CONCAT44(extraout_var_00,iVar3),
                        (char *)CONCAT44(extraout_var_01,iVar4),
                        (char *)CONCAT44(extraout_var_02,iVar5),in_R8);
    puVar14 = (undefined1 *)0xf;
    if (local_440 != &local_430) {
      puVar14 = local_430;
    }
    if (puVar14 < local_438 + local_418._M_string_length) {
      uVar15 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        uVar15 = local_418.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_438 + local_418._M_string_length) goto LAB_00162e3d;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,(ulong)local_440);
    }
    else {
LAB_00162e3d:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_418._M_dataplus._M_p)
      ;
    }
    local_3b0 = (cl_device_id)&local_3a0;
    p_Var1 = (cl_device_id)(puVar8 + 2);
    if ((cl_device_id)*puVar8 == p_Var1) {
      local_3a0 = *(undefined8 *)p_Var1;
      uStack_398 = puVar8[3];
    }
    else {
      local_3a0 = *(undefined8 *)p_Var1;
      local_3b0 = (cl_device_id)*puVar8;
    }
    local_3a8 = puVar8[1];
    *puVar8 = p_Var1;
    puVar8[1] = 0;
    *p_Var1 = (_cl_device_id)0x0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3b0);
    plVar13 = plVar7 + 2;
    if ((long *)*plVar7 == plVar13) {
      local_228 = *plVar13;
      lStack_220 = plVar7[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar13;
      local_238 = (long *)*plVar7;
    }
    local_230 = plVar7[1];
    *plVar7 = (long)plVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_3d0,(string *)&local_238);
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_3b0 != (cl_device_id)&local_3a0) {
      operator_delete(local_3b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p);
    }
    if (local_440 != &local_430) {
      operator_delete(local_440);
    }
    if (local_3f0[0] != local_3e0) {
      operator_delete(local_3f0[0]);
    }
    std::ifstream::ifstream(&local_238,(string *)&local_3d0,_S_in|_S_bin);
    if (*(int *)((long)aiStack_218 + local_238[-3]) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::ostream::operator<<((ostream *)&local_3b0,(streambuf *)&local_228);
      std::__cxx11::stringbuf::str();
      local_3f0[0] = local_438;
      local_418._M_dataplus._M_p = (pointer)local_440;
      iVar3 = (*runner->_vptr_IOclRunner[6])(runner);
      local_420 = *(cl_device_id *)(CONCAT44(extraout_var_03,iVar3) + 0x20);
      iVar3 = (*runner->_vptr_IOclRunner[2])(runner);
      program = OclLib::createProgramWithBinary
                          ((cl_context)CONCAT44(extraout_var_04,iVar3),1,&local_420,
                           (size_t *)local_3f0,(uchar **)&local_418,&local_3f4,&local_3f8);
      if (local_3f8 == 0) {
        cVar6 = OclLib::buildProgram
                          (program,1,&local_420,(char *)0x0,(_func_void_cl_program_void_ptr *)0x0,
                           (void *)0x0);
        if (cVar6 != 0) {
          OclLib::release(program);
          goto LAB_0016306f;
        }
      }
      else {
LAB_0016306f:
        program = (cl_program)0x0;
      }
      if (local_440 != &local_430) {
        operator_delete(local_440);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
      std::ios_base::~ios_base(local_340);
    }
    else {
      program = (cl_program)0x0;
    }
    std::ifstream::~ifstream(&local_238);
    if (program == (cl_program)0x0) goto LAB_001630b8;
  }
  else {
LAB_001630b8:
    pcVar9 = ocl_tag();
    iVar3 = (*runner->_vptr_IOclRunner[6])(runner);
    Log::print(INFO,"%s GPU \x1b[1;37m#%zu\x1b[0m \x1b[1;33mcompiling...\x1b[0m",pcVar9,
               (ulong)*(uint *)(CONCAT44(extraout_var_05,iVar3) + 0x74));
    iVar3 = (*runner->_vptr_IOclRunner[6])(runner);
    local_3b0 = *(cl_device_id *)(CONCAT44(extraout_var_06,iVar3) + 0x20);
    iVar3 = (*runner->_vptr_IOclRunner[5])(runner);
    local_440 = (undefined1 **)CONCAT44(extraout_var_07,iVar3);
    lVar10 = std::chrono::_V2::steady_clock::now();
    lVar10 = SUB168(SEXT816(lVar10) * SEXT816(-0x431bde82d7b634db),8);
    iVar3 = (*runner->_vptr_IOclRunner[2])(runner);
    program_00 = OclLib::createProgramWithSource
                           ((cl_context)CONCAT44(extraout_var_08,iVar3),1,(char **)&local_440,
                            (size_t *)0x0,(cl_int *)local_3f0);
    program = (cl_program)0x0;
    if ((int)local_3f0[0] == 0) {
      iVar3 = (*runner->_vptr_IOclRunner[3])(runner);
      cVar6 = OclLib::buildProgram
                        (program_00,1,&local_3b0,(char *)CONCAT44(extraout_var_09,iVar3),
                         (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
      if (cVar6 == 0) {
        pcVar9 = ocl_tag();
        iVar3 = (*runner->_vptr_IOclRunner[6])(runner);
        uVar2 = *(uint *)(CONCAT44(extraout_var_10,iVar3) + 0x74);
        lVar11 = std::chrono::_V2::steady_clock::now();
        Log::print(INFO,
                   "%s GPU \x1b[1;37m#%zu\x1b[0m \x1b[1;32mcompilation completed\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m"
                   ,pcVar9,(ulong)uVar2,lVar11 / 1000000 + ((lVar10 >> 0x12) - (lVar10 >> 0x3f)));
        program = program_00;
      }
      else {
        SVar16 = OclLib::getProgramBuildLog((OclLib *)&local_238,program_00,local_3b0);
        printf("BUILD LOG:\n%s\n",local_238,SVar16.m_size);
        if (local_238 != (long *)0x0) {
          operator_delete__(local_238);
        }
        OclLib::release(program_00);
        program = (cl_program)0x0;
      }
    }
    iVar3 = (*runner->_vptr_IOclRunner[6])(runner);
    if ((program != (cl_program)0x0) && (*(char *)(CONCAT44(extraout_var_11,iVar3) + 8) != '\0')) {
      save(program,&local_3d0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
LAB_00163257:
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  return program;
}

Assistant:

cl_program xmrig::OclCache::build(const IOclRunner *runner)
{
    std::lock_guard<std::mutex> lock(mutex);

    if (Nonce::sequence(Nonce::OPENCL) == 0) {
        return nullptr;
    }

    std::string fileName;
    if (runner->data().cache) {
#       ifdef _WIN32
        fileName = prefix() + "\\xmrig\\.cache\\" + cacheKey(runner) + ".bin";
#       else
        fileName = prefix() + "/.cache/" + cacheKey(runner) + ".bin";
#       endif

        cl_program program = createFromBinary(runner, fileName);
        if (program) {
            return program;
        }
    }

    cl_program program = createFromSource(runner);
    if (runner->data().cache && program) {
        save(program, fileName);
    }

    return program;
}